

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  char (*in_R8) [3];
  Newline *in_R9;
  Opcode local_6c;
  Info local_68;
  
  local_6c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_68,&local_6c);
  local_68.name._0_4_ = 0;
  local_68._4_8_ = 0;
  Write(this,(StackVar *)0x1);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(StackVar *)0x1,(char (*) [3])0x0,(StackVar *)&local_68,in_R8,in_R9);
  DropTypes(this,2);
  PushType(this,local_68.result_type);
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}